

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModuleHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>&,slang::syntax::ParameterPortListSyntax*,slang::syntax::PortListSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,Token *args_3,
          SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *args_4,
          ParameterPortListSyntax **args_5,PortListSyntax **args_6,Token *args_7)

{
  Token name;
  Token semi;
  ModuleHeaderSyntax *this_00;
  long in_RCX;
  Info *in_RDX;
  Token *in_R8;
  ParameterPortListSyntax *in_R9;
  Token *in_stack_00000018;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  BumpAllocator *in_stack_ffffffffffffff58;
  
  this_00 = (ModuleHeaderSyntax *)
            allocate(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  name.info = (Info *)in_RDX->rawTextPtr;
  name._0_8_ = *(undefined8 *)(in_RCX + 8);
  semi.info = in_RDX;
  semi.kind = (short)in_RCX;
  semi._2_1_ = (char)((ulong)in_RCX >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  semi.rawLen = (int)((ulong)in_RCX >> 0x20);
  slang::syntax::ModuleHeaderSyntax::ModuleHeaderSyntax
            (this_00,(SyntaxKind)((ulong)in_stack_00000018->info >> 0x20),*in_R8,*in_stack_00000018,
             name,(SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)in_RDX->location,
             in_R9,(PortListSyntax *)in_R8,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }